

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_ntop.c
# Opt level: O0

char * ares_inet_ntop(int af,void *src,char *dst,ares_socklen_t size)

{
  int *piVar1;
  ares_socklen_t size_local;
  char *dst_local;
  void *src_local;
  char *pcStack_10;
  int af_local;
  
  if (af == 2) {
    pcStack_10 = inet_ntop4((uchar *)src,dst,(ulong)size);
  }
  else if (af == 10) {
    pcStack_10 = inet_ntop6((uchar *)src,dst,(ulong)size);
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x61;
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char        *ares_inet_ntop(int af, const void *src, char *dst,
                                  ares_socklen_t size)
{
  switch (af) {
    case AF_INET:
      return inet_ntop4(src, dst, (size_t)size);
    case AF_INET6:
      return inet_ntop6(src, dst, (size_t)size);
    default:
      break;
  }
  SET_SOCKERRNO(EAFNOSUPPORT);
  return NULL;
}